

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu64.c
# Opt level: O2

void aarch64_a72_initfn(uc_struct_conflict2 *uc,CPUState *obj)

{
  obj[1].tb_jmp_cache[0xa11] = (TranslationBlock *)((ulong)obj[1].tb_jmp_cache[0xa11] | 0xb98040100)
  ;
  obj[1].tb_jmp_cache[0xa64] = (TranslationBlock *)0x410fd083;
  obj[1].tb_jmp_cache[0xa65] = (TranslationBlock *)0x8444c00441034080;
  obj[1].tb_jmp_cache[0xa66] = (TranslationBlock *)0x13100c50838;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa67) = 0x11011;
  obj[1].tb_jmp_cache[0xa58] = (TranslationBlock *)0x1211111110110222;
  obj[1].tb_jmp_cache[0xa59] = (TranslationBlock *)0x301006600000043;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa6a) = 0;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x52ac) = 0x4000000010201105;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x52b4) = 0x210221101260000;
  obj[1].tb_jmp_cache[0xa52] = (TranslationBlock *)0x1311211102101110;
  obj[1].tb_jmp_cache[0xa53] = (TranslationBlock *)0x111213121232042;
  obj[1].tb_jmp_cache[0xa54] = (TranslationBlock *)0x1112100011142;
  obj[1].tb_jmp_cache[0xa5d] = (TranslationBlock *)0x2222;
  obj[1].tb_jmp_cache[0xa62] = (TranslationBlock *)0x10305106;
  obj[1].tb_jmp_cache[0xa5b] = (TranslationBlock *)0x11120;
  obj[1].tb_jmp_cache[0xa5f] = (TranslationBlock *)0x1124;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa5a) = 0x3516d000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa6d) = 0xa200023;
  obj[1].tb_jmp_cache[0xa6f] = (TranslationBlock *)0x701fe00a;
  obj[1].tb_jmp_cache[0xa70] = (TranslationBlock *)0x201fe012;
  obj[1].tb_jmp_cache[0xa71] = (TranslationBlock *)0x707fe07a;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa81) = 4;
  obj[1].tb_jmp_cache[0xa83] = (TranslationBlock *)0x500000004;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa84) = 5;
  return;
}

Assistant:

static void aarch64_a72_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V8);
    set_feature(&cpu->env, ARM_FEATURE_NEON);
    set_feature(&cpu->env, ARM_FEATURE_GENERIC_TIMER);
    set_feature(&cpu->env, ARM_FEATURE_AARCH64);
    set_feature(&cpu->env, ARM_FEATURE_CBAR_RO);
    set_feature(&cpu->env, ARM_FEATURE_EL2);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    set_feature(&cpu->env, ARM_FEATURE_PMU);
    cpu->midr = 0x410fd083;
    cpu->revidr = 0x00000000;
    cpu->reset_fpsid = 0x41034080;
    cpu->isar.mvfr0 = 0x10110222;
    cpu->isar.mvfr1 = 0x12111111;
    cpu->isar.mvfr2 = 0x00000043;
    cpu->ctr = 0x8444c004;
    cpu->reset_sctlr = 0x00c50838;
    cpu->id_pfr0 = 0x00000131;
    cpu->id_pfr1 = 0x00011011;
    cpu->isar.id_dfr0 = 0x03010066;
    cpu->id_afr0 = 0x00000000;
    cpu->isar.id_mmfr0 = 0x10201105;
    cpu->isar.id_mmfr1 = 0x40000000;
    cpu->isar.id_mmfr2 = 0x01260000;
    cpu->isar.id_mmfr3 = 0x02102211;
    cpu->isar.id_isar0 = 0x02101110;
    cpu->isar.id_isar1 = 0x13112111;
    cpu->isar.id_isar2 = 0x21232042;
    cpu->isar.id_isar3 = 0x01112131;
    cpu->isar.id_isar4 = 0x00011142;
    cpu->isar.id_isar5 = 0x00011121;
    cpu->isar.id_aa64pfr0 = 0x00002222;
    cpu->isar.id_aa64dfr0 = 0x10305106;
    cpu->isar.id_aa64isar0 = 0x00011120;
    cpu->isar.id_aa64mmfr0 = 0x00001124;
    cpu->isar.dbgdidr = 0x3516d000;
    cpu->clidr = 0x0a200023;
    cpu->ccsidr[0] = 0x701fe00a; /* 32KB L1 dcache */
    cpu->ccsidr[1] = 0x201fe012; /* 48KB L1 icache */
    cpu->ccsidr[2] = 0x707fe07a; /* 1MB L2 cache */
    cpu->dcz_blocksize = 4; /* 64 bytes */
    cpu->gic_num_lrs = 4;
    cpu->gic_vpribits = 5;
    cpu->gic_vprebits = 5;
}